

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uparse.cpp
# Opt level: O3

int32_t u_parseCodePointRangeAnyTerminator
                  (char *s,uint32_t *pStart,uint32_t *pEnd,char **terminator,UErrorCode *pErrorCode)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  byte *__nptr;
  char *end;
  byte *local_38;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
  if (pEnd == (uint32_t *)0x0 || (pStart == (uint32_t *)0x0 || s == (char *)0x0)) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;
  }
  while (((ulong)(byte)*s < 0x21 && ((0x100002600U >> ((ulong)(byte)*s & 0x3f) & 1) != 0))) {
    s = (char *)((byte *)s + 1);
  }
  uVar3 = strtoul(s,(char **)&local_38,0x10);
  uVar2 = (uint)uVar3;
  if (uVar2 < 0x110000 && s < local_38) {
    *pEnd = uVar2;
    *pStart = uVar2;
    __nptr = local_38 + 2;
    do {
      uVar3 = (ulong)__nptr[-2];
      if (0x2e < uVar3) {
LAB_001eb581:
        *terminator = (char *)local_38;
        return 1;
      }
      if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
        if ((uVar3 == 0x2e) && (__nptr[-1] == 0x2e)) goto LAB_001eb56c;
        goto LAB_001eb581;
      }
      __nptr = __nptr + 1;
    } while( true );
  }
LAB_001eb536:
  *pErrorCode = U_PARSE_ERROR;
  return 0;
LAB_001eb56c:
  while (((ulong)*__nptr < 0x21 && ((0x100002600U >> ((ulong)*__nptr & 0x3f) & 1) != 0))) {
    __nptr = __nptr + 1;
  }
  uVar3 = strtoul((char *)__nptr,(char **)&local_38,0x10);
  uVar2 = (uint)uVar3;
  if (uVar2 < 0x110000 && __nptr < local_38) {
    *pEnd = uVar2;
    uVar1 = *pStart;
    if (uVar1 <= uVar2) {
      *terminator = (char *)local_38;
      return (uVar2 - uVar1) + 1;
    }
  }
  goto LAB_001eb536;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_parseCodePointRangeAnyTerminator(const char *s,
                                   uint32_t *pStart, uint32_t *pEnd,
                                   const char **terminator,
                                   UErrorCode *pErrorCode) {
    char *end;
    uint32_t value;

    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(s==NULL || pStart==NULL || pEnd==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* read the start code point */
    s=u_skipWhitespace(s);
    value=(uint32_t)uprv_strtoul(s, &end, 16);
    if(end<=s || value>=0x110000) {
        *pErrorCode=U_PARSE_ERROR;
        return 0;
    }
    *pStart=*pEnd=value;

    /* is there a "..end"? */
    s=u_skipWhitespace(end);
    if(*s!='.' || s[1]!='.') {
        *terminator=end;
        return 1;
    }
    s=u_skipWhitespace(s+2);

    /* read the end code point */
    value=(uint32_t)uprv_strtoul(s, &end, 16);
    if(end<=s || value>=0x110000) {
        *pErrorCode=U_PARSE_ERROR;
        return 0;
    }
    *pEnd=value;

    /* is this a valid range? */
    if(value<*pStart) {
        *pErrorCode=U_PARSE_ERROR;
        return 0;
    }

    *terminator=end;
    return value-*pStart+1;
}